

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

base_learner * oaa_setup(options_i *options,vw *all)

{
  uint32_t uVar1;
  namedlabels *pnVar2;
  uint32_t *puVar3;
  _Head_base<0UL,_oaa_*,_false> _Var4;
  bool bVar5;
  int iVar6;
  option_group_definition *poVar7;
  polyprediction *ppVar8;
  uint *puVar9;
  base_learner *l;
  single_learner *base;
  ostream *poVar10;
  learner<oaa,_example> *plVar11;
  undefined8 uVar12;
  vw_exception *this;
  size_t i;
  ulong uVar13;
  ulong uVar14;
  code *predict;
  code *learn;
  size_t i_1;
  long lVar15;
  long lVar16;
  float fVar17;
  bool scores;
  bool probabilities;
  free_ptr<oaa> data;
  allocator local_518;
  allocator local_517;
  allocator local_516;
  allocator local_515;
  allocator local_514;
  allocator local_513;
  allocator local_512;
  allocator local_511;
  string local_510 [32];
  string local_4f0;
  string local_4d0 [32];
  string local_4b0;
  string local_490 [32];
  string local_470;
  string local_450 [32];
  string local_430;
  string local_410;
  string local_3f0;
  option_group_definition new_options;
  stringstream __msg;
  undefined1 local_388 [96];
  bool local_328;
  undefined1 local_210 [160];
  undefined1 local_170 [160];
  undefined1 local_d0 [160];
  
  scoped_calloc_or_throw<oaa>();
  probabilities = false;
  scores = false;
  std::__cxx11::string::string((string *)&local_410,"One Against All Options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string((string *)&local_430,"oaa",&local_511);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)&__msg,&local_430,
             &(data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
              _M_head_impl)->k);
  local_328 = true;
  std::__cxx11::string::string(local_450,"One-against-all multiclass with <k> labels",&local_512);
  std::__cxx11::string::_M_assign((string *)(local_388 + 0x20));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&new_options,(typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::string((string *)&local_470,"oaa_subsample",&local_513);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_210,&local_470,
             &(data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
              _M_head_impl)->num_subsample);
  std::__cxx11::string::string
            (local_490,"subsample this number of negative examples when learning",&local_514);
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,(typed_option<unsigned_long> *)local_210);
  std::__cxx11::string::string((string *)&local_4b0,"probabilities",&local_515);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d0,&local_4b0,&probabilities);
  std::__cxx11::string::string(local_4d0,"predict probabilites of all classes",&local_516);
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_d0);
  std::__cxx11::string::string((string *)&local_4f0,"scores",&local_517);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_170,&local_4f0,&scores);
  std::__cxx11::string::string(local_510,"output raw scores per class",&local_518);
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar7,(typed_option<bool> *)local_170);
  std::__cxx11::string::~string(local_510);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_170);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string(local_4d0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string(local_490);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_210);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string(local_450);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)&__msg);
  std::__cxx11::string::~string((string *)&local_430);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"oaa",(allocator *)local_210);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 == '\0') {
    plVar11 = (learner<oaa,_example> *)0x0;
  }
  else {
    pnVar2 = all->sd->ldict;
    if ((pnVar2 != (namedlabels *)0x0) &&
       ((data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
        _M_head_impl)->k != (ulong)pnVar2->K)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar10 = std::operator<<((ostream *)local_388,"error: you have ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::operator<<(poVar10," named labels; use that as the argument to oaa");
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/oaa.cc"
                 ,0xdf,&local_3f0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
    _M_head_impl)->all = all;
    ppVar8 = calloc_or_throw<polyprediction>
                       ((data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k);
    (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
    _M_head_impl)->pred = ppVar8;
    (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
    _M_head_impl)->subsample_order = (uint32_t *)0x0;
    (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
    _M_head_impl)->subsample_id = 0;
    if ((data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
        _M_head_impl)->num_subsample != 0) {
      if ((data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
          _M_head_impl)->num_subsample <
          (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
          _M_head_impl)->k) {
        puVar9 = calloc_or_throw<unsigned_int>
                           ((data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k);
        (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
        _M_head_impl)->subsample_order = puVar9;
        for (uVar13 = 0;
            uVar14 = (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k, uVar13 < uVar14;
            uVar13 = uVar13 + 1) {
          (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
          _M_head_impl)->subsample_order[uVar13] = (uint32_t)uVar13;
        }
        lVar16 = 0;
        for (uVar13 = 0; uVar13 < uVar14; uVar13 = uVar13 + 1) {
          fVar17 = merand48(&all->random_state);
          fVar17 = fVar17 * (float)((data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                                     super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                                     super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k + lVar16);
          uVar14 = (ulong)fVar17;
          lVar15 = ((long)(fVar17 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14) + uVar13;
          puVar3 = (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->subsample_order;
          uVar1 = puVar3[uVar13];
          puVar3[uVar13] = puVar3[lVar15];
          (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
          _M_head_impl)->subsample_order[lVar15] = uVar1;
          uVar14 = (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k;
          lVar16 = lVar16 + -1;
        }
      }
      else {
        (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
        _M_head_impl)->num_subsample = 0;
        poVar10 = std::operator<<(&(all->trace_message).super_ostream,
                                  "oaa is turning off subsampling because your parameter >= K");
        std::endl<char,std::char_traits<char>>(poVar10);
      }
    }
    _Var4._M_head_impl =
         data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_oaa_*,_false>.
         _M_head_impl;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    if (probabilities == false) {
      if (scores == false) {
        learn = predict_or_learn<true,false,false,false>;
        if (0 < all->raw_prediction) {
          learn = predict_or_learn<true,true,false,false>;
        }
        predict = predict_or_learn<false,false,false,false>;
        if (0 < all->raw_prediction) {
          predict = predict_or_learn<false,true,false,false>;
        }
        plVar11 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                            (&data,base,learn,predict,all->p,
                             (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k,multiclass);
      }
      else {
        all->delete_prediction = delete_scalars;
        plVar11 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                            (&data,base,predict_or_learn<true,false,true,false>,
                             predict_or_learn<false,false,true,false>,all->p,
                             (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k,scalars);
        *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
        *(code **)(plVar11 + 0x68) = finish_example_scores<false>;
      }
    }
    else {
      all->delete_prediction = delete_scalars;
      (**all->loss->_vptr_loss_function)(&__msg);
      bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__msg,"logistic");
      if (bVar5) {
        poVar10 = std::operator<<(&(all->trace_message).super_ostream,
                                  "WARNING: --probabilities should be used only with --loss_function=logistic"
                                 );
        std::endl<char,std::char_traits<char>>(poVar10);
      }
      plVar11 = LEARNER::init_multiclass_learner<oaa,example,LEARNER::learner<char,example>>
                          (&data,base,predict_or_learn<true,false,true,true>,
                           predict_or_learn<false,false,true,true>,all->p,
                           (data._M_t.super___uniq_ptr_impl<oaa,_void_(*)(void_*)>._M_t.
                            super__Tuple_impl<0UL,_oaa_*,_void_(*)(void_*)>.
                            super__Head_base<0UL,_oaa_*,_false>._M_head_impl)->k,scalars);
      all->sd->report_multiclass_log_loss = true;
      *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
      *(code **)(plVar11 + 0x68) = finish_example_scores<true>;
      std::__cxx11::string::~string((string *)&__msg);
    }
    if ((_Var4._M_head_impl)->num_subsample == 0) {
      uVar12 = *(undefined8 *)(plVar11 + 0x18);
    }
    else {
      *(code **)(plVar11 + 0x28) = learn_randomized;
      uVar12 = *(undefined8 *)(plVar11 + 0x18);
      *(undefined8 *)(plVar11 + 0x58) = uVar12;
      *(code **)(plVar11 + 0x68) = MULTICLASS::finish_example_without_loss<oaa>;
    }
    *(undefined8 *)(plVar11 + 0xb8) = uVar12;
    *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<oaa,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar11;
}

Assistant:

LEARNER::base_learner* oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<oaa>();
  bool probabilities = false;
  bool scores = false;
  option_group_definition new_options("One Against All Options");
  new_options.add(make_option("oaa", data->k).keep().help("One-against-all multiclass with <k> labels"))
      .add(make_option("oaa_subsample", data->num_subsample)
               .help("subsample this number of negative examples when learning"))
      .add(make_option("probabilities", probabilities).help("predict probabilites of all classes"))
      .add(make_option("scores", scores).help("output raw scores per class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("oaa"))
    return nullptr;

  if (all.sd->ldict && (data->k != all.sd->ldict->getK()))
    THROW("error: you have " << all.sd->ldict->getK() << " named labels; use that as the argument to oaa")

  data->all = &all;
  data->pred = calloc_or_throw<polyprediction>(data->k);
  data->subsample_order = nullptr;
  data->subsample_id = 0;
  if (data->num_subsample > 0)
  {
    if (data->num_subsample >= data->k)
    {
      data->num_subsample = 0;
      all.trace_message << "oaa is turning off subsampling because your parameter >= K" << endl;
    }
    else
    {
      data->subsample_order = calloc_or_throw<uint32_t>(data->k);
      for (size_t i = 0; i < data->k; i++) data->subsample_order[i] = (uint32_t)i;
      for (size_t i = 0; i < data->k; i++)
      {
        size_t j = (size_t)(merand48(all.random_state) * (float)(data->k - i)) + i;
        uint32_t tmp = data->subsample_order[i];
        data->subsample_order[i] = data->subsample_order[j];
        data->subsample_order[j] = tmp;
      }
    }
  }

  oaa* data_ptr = data.get();
  LEARNER::learner<oaa, example>* l;
  auto base = as_singleline(setup_base(options, all));
  if (probabilities || scores)
  {
    all.delete_prediction = delete_scalars;
    if (probabilities)
    {
      auto loss_function_type = all.loss->getType();
      if (loss_function_type != "logistic")
        all.trace_message << "WARNING: --probabilities should be used only with --loss_function=logistic" << endl;
      // the three boolean template parameters are: is_learn, print_all and scores
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, true>,
          predict_or_learn<false, false, true, true>, all.p, data->k, prediction_type::scalars);
      all.sd->report_multiclass_log_loss = true;
      l->set_finish_example(finish_example_scores<true>);
    }
    else
    {
      l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, true, false>,
          predict_or_learn<false, false, true, false>, all.p, data->k, prediction_type::scalars);
      l->set_finish_example(finish_example_scores<false>);
    }
  }
  else if (all.raw_prediction > 0)
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, true, false, false>,
        predict_or_learn<false, true, false, false>, all.p, data->k, prediction_type::multiclass);
  else
    l = &LEARNER::init_multiclass_learner(data, base, predict_or_learn<true, false, false, false>,
        predict_or_learn<false, false, false, false>, all.p, data->k, prediction_type::multiclass);

  if (data_ptr->num_subsample > 0) {
    l->set_learn(learn_randomized);
    l->set_finish_example(MULTICLASS::finish_example_without_loss<oaa>);
  }
  l->set_finish(finish);

  return make_base(*l);
}